

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_epsv_disable(connectdata *conn)

{
  int *piVar1;
  CURLcode CVar2;
  
  if ((conn->bits).ipv6 == true) {
    Curl_failf(conn->data,"Failed EPSV attempt, exiting\n");
    CVar2 = CURLE_WEIRD_SERVER_REPLY;
  }
  else {
    Curl_infof(conn->data,"Failed EPSV attempt. Disabling EPSV\n");
    (conn->bits).ftp_use_epsv = false;
    (conn->data->state).errorbuf = false;
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","PASV");
    if (CVar2 == CURLE_OK) {
      piVar1 = &(conn->proto).ftpc.count1;
      *piVar1 = *piVar1 + 1;
      (conn->proto).ftpc.state = FTP_PASV;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_epsv_disable(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.ipv6) {
    /* We can't disable EPSV when doing IPv6, so this is instead a fail */
    failf(conn->data, "Failed EPSV attempt, exiting\n");
    return CURLE_WEIRD_SERVER_REPLY;
  }

  infof(conn->data, "Failed EPSV attempt. Disabling EPSV\n");
  /* disable it for next transfer */
  conn->bits.ftp_use_epsv = FALSE;
  conn->data->state.errorbuf = FALSE; /* allow error message to get
                                         rewritten */
  PPSENDF(&conn->proto.ftpc.pp, "%s", "PASV");
  conn->proto.ftpc.count1++;
  /* remain in/go to the FTP_PASV state */
  state(conn, FTP_PASV);
  return result;
}